

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsortfilterproxymodel.cpp
# Opt level: O0

int __thiscall
QSortFilterProxyModel::qt_metacall(QSortFilterProxyModel *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  void **in_stack_00000070;
  int in_stack_00000078;
  Call in_stack_0000007c;
  QObject *in_stack_00000080;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QAbstractProxyModel::qt_metacall
                    ((QAbstractProxyModel *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),
                     (int)in_RCX,in_RDI);
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 0xd) {
        qt_static_metacall(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070);
      }
      iVar1 = iVar1 + -0xd;
    }
    if (in_ESI == 7) {
      if (iVar1 < 0xd) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *(QMetaTypeInterface **)*in_RCX = local_10.d_ptr;
      }
      iVar1 = iVar1 + -0xd;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070);
      iVar1 = iVar1 + -10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int QSortFilterProxyModel::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractProxyModel::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 13)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 13;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 13)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 13;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 10;
    }
    return _id;
}